

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vis.c
# Opt level: O3

char * vis(char *mbdst,wchar_t c,wchar_t flags,wchar_t nextc)

{
  wchar_t wVar1;
  char *pcVar2;
  char cc [2];
  char local_1a;
  undefined1 local_19;
  char *local_18;
  
  local_1a = (char)c;
  local_19 = (undefined1)nextc;
  local_18 = mbdst;
  wVar1 = istrsenvisx(&local_18,(size_t *)0x0,&local_1a,1,flags,"",(wchar_t *)0x0);
  pcVar2 = local_18 + (uint)wVar1;
  if (wVar1 < L'\0') {
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

char *
vis(char *mbdst, int c, int flags, int nextc)
{
	char cc[2];
	int ret;

	cc[0] = c;
	cc[1] = nextc;

	ret = istrsenvisx(&mbdst, NULL, cc, 1, flags, "", NULL);
	if (ret < 0)
		return NULL;
	return mbdst + ret;
}